

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O3

RecyclableObject *
Js::JavascriptRegExp::GetThisObject(Arguments *args,PCWSTR varName,ScriptContext *scriptContext)

{
  BOOL BVar1;
  Var pvVar2;
  RecyclableObject *pRVar3;
  
  if (((ulong)args->Info & 0xffffff) != 0) {
    pvVar2 = Arguments::operator[](args,0);
    BVar1 = JavascriptOperators::IsObject(pvVar2);
    if (BVar1 != 0) {
      pvVar2 = Arguments::operator[](args,0);
      pRVar3 = VarTo<Js::RecyclableObject>(pvVar2);
      return pRVar3;
    }
  }
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec41,varName);
}

Assistant:

RecyclableObject* JavascriptRegExp::GetThisObject(Arguments& args, PCWSTR varName, ScriptContext* scriptContext)
    {
        if (args.Info.Count == 0 || !JavascriptOperators::IsObject(args[0]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedObject, varName);
        }

        return VarTo<RecyclableObject>(args[0]);
    }